

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O3

void model_skip_for_sb_y_large
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,MACROBLOCK *x,MACROBLOCKD *xd,
               RD_STATS *rd_stats,int *early_term,int calculate_rd,int64_t best_sse,uint *var_output
               ,uint var_prune_threshold)

{
  PREDICTION_MODE PVar1;
  INTER_SEARCH_EARLY_TERM_IDX IVar2;
  MB_MODE_INFO *pMVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint *var_tx;
  byte bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint32_t *puVar13;
  int *piVar14;
  int iVar15;
  uint uVar16;
  uint8_t *puVar17;
  double *pdVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  AV1_COMP *cpi_00;
  uint8_t *puVar23;
  ulong uVar24;
  long lVar25;
  BLOCK_SIZE bsize_00;
  uint uVar26;
  uint uVar27;
  uint *sse_tx;
  long lVar28;
  uint32_t *puVar29;
  ulong uVar30;
  uint in_stack_fffffffffffff138;
  ulong uVar31;
  uint sse;
  ulong local_eb8;
  ulong local_eb0;
  int sum;
  AV1_COMP *local_ea0;
  ulong local_e98;
  uint8_t *local_e90;
  uint8_t *local_e88;
  int local_e80;
  int local_e7c;
  MACROBLOCKD *local_e78;
  AV1_COMP *local_e70;
  long local_e68;
  long local_e60;
  ulong local_e58;
  ulong local_e50;
  ulong local_e48;
  ulong local_e40;
  int sum_1;
  uint var16x16 [64];
  uint var8x8 [256];
  uint sse8x8 [256];
  int sum8x8 [256];
  
  if (x->force_zeromv_skip_for_blk != 0) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }
  local_ea0 = cpi;
  local_e80 = mi_row;
  local_e7c = mi_col;
  local_e78 = xd;
  local_e70 = (AV1_COMP *)x;
  if ((BLOCK_32X32 < bsize) && ((x->txfm_search_params).tx_mode_search_type != '\0')) {
    (*xd->mi)->tx_size = '\x02';
    local_eb8 = (ulong)bsize;
    bVar9 = ""[local_eb8];
    bVar6 = ""[local_eb8];
    uVar30 = (ulong)bVar6;
    uVar26 = (uint)bVar6;
    memset(sse8x8,0,0x100);
    memset(sum8x8,0,0x100);
    puVar17 = x->plane[0].src.buf;
    iVar15 = x->plane[0].src.stride;
    puVar23 = xd->plane[0].dst.buf;
    iVar20 = xd->plane[0].dst.stride;
    local_e68 = CONCAT44(local_e68._4_4_,(uint)bVar9);
    iVar19 = 4 << (bVar9 & 0x1f);
    uVar11 = 4 << (bVar6 & 0x1f);
    var8x8[0] = 0;
    sum_1 = 0;
    uVar7 = 0;
    if (0 < (int)uVar11) {
      local_e50 = (ulong)uVar11;
      local_e58 = (long)iVar20 << 4;
      local_e60 = (long)iVar15 << 4;
      uVar7 = 0;
      iVar10 = 0;
      local_e98 = CONCAT44(local_e98._4_4_,iVar19);
      do {
        local_e48 = uVar7;
        if (0 < iVar19) {
          puVar29 = (uint32_t *)(sum8x8 + iVar10);
          puVar13 = sse8x8 + iVar10;
          lVar28 = 0;
          local_e90 = puVar23;
          local_e88 = puVar17;
          do {
            local_eb0 = CONCAT44(local_eb0._4_4_,iVar10);
            (*aom_get_var_sse_sum_16x16_dual)
                      (local_e88 + lVar28,iVar15,local_e90 + lVar28,iVar20,puVar13,var8x8,&sum_1,
                       puVar29);
            lVar28 = lVar28 + 0x20;
            iVar10 = (int)local_eb0 + 2;
            puVar29 = puVar29 + 2;
            puVar13 = puVar13 + 2;
            puVar17 = local_e88;
            puVar23 = local_e90;
            iVar19 = (int)local_e98;
          } while ((int)lVar28 < (int)local_e98);
        }
        uVar26 = (uint)uVar30;
        uVar7 = local_e48 + 0x10;
        puVar23 = puVar23 + local_e58;
        puVar17 = puVar17 + local_e60;
      } while (uVar7 < local_e50);
      uVar7 = (ulong)var8x8[0];
      in_stack_fffffffffffff138 = uVar26;
    }
    cpi_00 = local_e70;
    uVar30 = local_eb8;
    uVar26 = uVar26 + (int)local_e68;
    cVar4 = (char)uVar26;
    uVar11 = (uint)uVar7;
    uVar27 = uVar11 - (int)((ulong)((long)sum_1 * (long)sum_1) >> (cVar4 + 4U & 0x3f));
    if ((var_output != (uint *)0x0) && (*var_output = uVar27, var_prune_threshold < uVar27)) {
      return;
    }
    rd_stats->sse = uVar7;
    *early_term = 0;
    if (*(char *)((long)((local_e70->td).mb.coeff_costs.coeff_costs[2][0].lps_cost + 6) + 0x40) ==
        '\x02') {
      if (((((local_ea0->sf).rt_sf.tx_size_level_based_on_qstep < 2) ||
           (iVar15 = (int)*(short *)(*(long *)(local_e70->enc_quant_dequant_params).quants.y_quant
                                              [7] + 2) >>
                     ((char)(local_e70->enc_quant_dequant_params).quants.y_zbin[0xb3][0] - 5U & 0x1f
                     ), uVar16 = iVar15 * iVar15, uVar16 <= uVar11)) ||
          (uVar16 <= (uint)(local_e70->td).mb.coeff_costs.coeff_costs[2][1].base_cost[0xf][0])) ||
         ((*(char *)((long)((local_e70->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 6)
           != '\0' ||
          (*(char *)((long)((local_e70->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 7)
           != '\0')))) {
        bVar5 = false;
      }
      else {
        *early_term = 1;
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    if ((calculate_rd == 0) &&
       (IVar2 = (local_ea0->sf).rt_sf.sse_early_term_inter_search, IVar2 != EARLY_TERM_DISABLED)) {
      uVar24 = (ulong)""[local_eb8];
      if (IVar2 == EARLY_TERM_IDX_4) {
        PVar1 = (*local_e78->mi)->mode;
        if ((PVar1 == '\r') || (PVar1 == '\x10')) {
          pdVar18 = (double *)
                    (early_term_inter_search_with_sse_early_term_thresh_newmv_nearestmv + uVar24 * 8
                    );
        }
        else {
          pdVar18 = (double *)
                    (early_term_inter_search_with_sse_early_term_thresh + uVar24 * 8 + 0x60);
        }
      }
      else {
        if ((int)IVar2 < 1) goto LAB_00221db1;
        pdVar18 = (double *)
                  (early_term_inter_search_with_sse_early_term_thresh +
                  uVar24 * 8 + (ulong)(IVar2 - EARLY_TERM_IDX_1) * 0x20);
      }
      if (!bVar5 && (double)uVar7 * *pdVar18 <= (double)best_sse) {
LAB_002220f3:
        set_early_term_based_on_uv_plane
                  (local_ea0,(MACROBLOCK *)local_e70,(BLOCK_SIZE)local_eb8,local_e78,local_e80,
                   local_e7c,early_term,(1 << (cVar4 - 2U & 0x1f)) >> 2,sse8x8,(uint *)sum8x8,sum_1,
                   uVar27,uVar11);
        uVar7 = (ulong)var8x8[0];
      }
    }
    else {
LAB_00221db1:
      uVar26 = in_stack_fffffffffffff138;
      if (!bVar5) goto LAB_002220f3;
    }
    bsize_00 = (BLOCK_SIZE)uVar7;
    goto LAB_00222160;
  }
  uVar30 = (ulong)bsize;
  bVar9 = ""[uVar30];
  bVar6 = ""[uVar30];
  puVar23 = (uint8_t *)0x0;
  memset(sse8x8,0,0x400);
  memset(sum8x8,0,0x400);
  memset(var8x8,0,0x400);
  local_e88 = x->plane[0].src.buf;
  iVar15 = x->plane[0].src.stride;
  puVar17 = xd->plane[0].dst.buf;
  uVar7 = (ulong)xd->plane[0].dst.stride;
  iVar20 = 4 << (bVar9 & 0x1f);
  uVar26 = 4 << (bVar6 & 0x1f);
  sse = 0;
  sum = 0;
  uVar24 = 0;
  local_eb8 = (ulong)bVar9;
  local_e40 = (ulong)bVar6;
  if (0 < (int)uVar26) {
    local_e58 = (ulong)uVar26;
    local_e60 = uVar7 * 8;
    local_e68 = (long)iVar15 * 8;
    uVar24 = 0;
    iVar19 = 0;
    local_e98 = CONCAT44(local_e98._4_4_,iVar20);
    local_e48 = uVar7;
    do {
      local_e50 = uVar24;
      if (0 < iVar20) {
        puVar13 = var8x8 + iVar19;
        piVar14 = sum8x8 + iVar19;
        puVar29 = sse8x8 + iVar19;
        lVar28 = 0;
        local_e90 = puVar17;
        do {
          local_eb0 = CONCAT44(local_eb0._4_4_,iVar19);
          (*aom_get_var_sse_sum_8x8_quad)
                    (local_e88 + lVar28,iVar15,local_e90 + lVar28,(int)uVar7,puVar29,piVar14,&sse,
                     &sum,puVar13);
          lVar28 = lVar28 + 0x20;
          iVar19 = (int)local_eb0 + 4;
          puVar13 = puVar13 + 4;
          piVar14 = piVar14 + 4;
          puVar29 = puVar29 + 4;
          puVar17 = local_e90;
          uVar7 = local_e48;
          iVar20 = (int)local_e98;
        } while ((int)lVar28 < (int)local_e98);
      }
      uVar24 = local_e50 + 8;
      puVar17 = puVar17 + local_e60;
      local_e88 = local_e88 + local_e68;
    } while (uVar24 < local_e58);
    uVar24 = (ulong)sse;
    puVar23 = (uint8_t *)(ulong)(uint)sum;
    bVar9 = (byte)local_eb8;
  }
  cpi_00 = local_e70;
  cVar4 = (char)local_e40 + bVar9;
  uVar26 = (uint)uVar24 -
           (int)((ulong)((long)(int)puVar23 * (long)(int)puVar23) >> (cVar4 + 4U & 0x3f));
  if ((var_output != (uint *)0x0) && (*var_output = uVar26, var_prune_threshold < uVar26)) {
    return;
  }
  rd_stats->sse = uVar24;
  *early_term = 0;
  local_eb0 = uVar24;
  local_e88 = puVar23;
  bVar6 = calculate_tx_size(local_ea0,(BLOCK_SIZE)uVar30,(MACROBLOCK *)local_e70,uVar26,(uint)uVar24
                            ,early_term);
  bVar9 = 1;
  if (1 < bVar6) {
    bVar9 = bVar6;
  }
  pMVar3 = *local_e78->mi;
  pMVar3->tx_size = bVar9;
  uVar7 = local_eb0;
  uVar31 = uVar30;
  if ((calculate_rd == 0) &&
     (IVar2 = (local_ea0->sf).rt_sf.sse_early_term_inter_search, IVar2 != EARLY_TERM_DISABLED)) {
    uVar8 = (ulong)""[uVar30];
    if (IVar2 == EARLY_TERM_IDX_4) {
      PVar1 = pMVar3->mode;
      if ((PVar1 == '\r') || (PVar1 == '\x10')) {
        pdVar18 = (double *)
                  (early_term_inter_search_with_sse_early_term_thresh_newmv_nearestmv + uVar8 * 8);
      }
      else {
        pdVar18 = (double *)(early_term_inter_search_with_sse_early_term_thresh + uVar8 * 8 + 0x60);
      }
    }
    else {
      if ((int)IVar2 < 1) goto LAB_00221d8a;
      pdVar18 = (double *)
                (early_term_inter_search_with_sse_early_term_thresh +
                uVar8 * 8 + (ulong)(IVar2 - EARLY_TERM_IDX_1) * 0x20);
    }
    if ((double)uVar24 * *pdVar18 <= (double)best_sse) goto LAB_00221d8a;
  }
  else {
LAB_00221d8a:
    if (*early_term == 0) {
      local_e90 = (uint8_t *)(ulong)uVar26;
      memset(&sum_1,0,0x100);
      memset(var16x16,0,0x100);
      uVar26 = 1 << (cVar4 - 2U & 0x1f);
      uVar7 = (ulong)uVar26;
      if (bVar6 < 2) {
        sse_tx = sse8x8;
        var_tx = var8x8;
      }
      else {
        iVar15 = (int)local_e40 + -1;
        if (iVar15 != 0x1f) {
          uVar11 = (int)local_eb8 - 1;
          local_eb8 = (ulong)uVar11;
          bVar9 = (byte)uVar11;
          iVar20 = 0;
          uVar27 = 0;
          do {
            if (uVar11 != 0x1f) {
              lVar25 = (long)iVar20;
              lVar28 = (long)(int)(uVar27 << (bVar9 & 0x1f));
              lVar21 = (long)(int)((uVar27 | 1) << (bVar9 & 0x1f));
              lVar22 = 0;
              do {
                iVar19 = sse8x8[lVar28 + lVar22 + 1] + sse8x8[lVar28 + lVar22] +
                         sse8x8[lVar21 + lVar22] + sse8x8[lVar21 + lVar22 + 1];
                *(int *)((long)&sum_1 + lVar22 * 2 + lVar25 * 4) = iVar19;
                lVar12 = (long)sum8x8[lVar21 + lVar22 + 1] + (long)sum8x8[lVar21 + lVar22] +
                         (long)sum8x8[lVar28 + lVar22 + 1] + (long)sum8x8[lVar28 + lVar22];
                *(int *)((long)var16x16 + lVar22 * 2 + lVar25 * 4) =
                     iVar19 - (int)((ulong)(lVar12 * lVar12) >> 8);
                lVar22 = lVar22 + 2;
                iVar20 = iVar20 + 1;
              } while (lVar22 < 1 << (bVar9 & 0x1f));
            }
            uVar27 = uVar27 + 2;
          } while ((int)uVar27 < 1 << ((byte)iVar15 & 0x1f));
        }
        uVar26 = uVar26 >> 2;
        sse_tx = (uint *)&sum_1;
        var_tx = var16x16;
        cpi_00 = local_e70;
        local_e98 = uVar7;
      }
      uVar31 = uVar30;
      set_early_term_based_on_uv_plane
                (local_ea0,(MACROBLOCK *)cpi_00,(BLOCK_SIZE)uVar30,local_e78,local_e80,local_e7c,
                 early_term,uVar26,sse_tx,var_tx,(int)local_e88,(uint)local_e90,(uint)local_eb0);
      uVar7 = (ulong)sse;
    }
  }
  uVar26 = (uint)uVar31;
  bsize_00 = (BLOCK_SIZE)uVar7;
LAB_00222160:
  calc_rate_dist_block_param
            (cpi_00,(MACROBLOCK *)rd_stats,(RD_STATS *)(ulong)(uint)calculate_rd,(int)early_term,
             (int *)(uVar30 & 0xffffffff),bsize_00,uVar26);
  return;
}

Assistant:

static void model_skip_for_sb_y_large(AV1_COMP *cpi, BLOCK_SIZE bsize,
                                      int mi_row, int mi_col, MACROBLOCK *x,
                                      MACROBLOCKD *xd, RD_STATS *rd_stats,
                                      int *early_term, int calculate_rd,
                                      int64_t best_sse,
                                      unsigned int *var_output,
                                      unsigned int var_prune_threshold) {
  if (x->force_zeromv_skip_for_blk) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }

  // For block sizes greater than 32x32, the transform size is always 16x16.
  // This function avoids calling calculate_variance() for tx_size 16x16 cases
  // by directly populating variance at tx_size level from
  // block_variance_16x16_dual() function.
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  if (CAP_TX_SIZE_FOR_BSIZE_GT32(txfm_params->tx_mode_search_type, bsize)) {
    xd->mi[0]->tx_size = TX_SIZE_FOR_BSIZE_GT32;
    model_skip_for_sb_y_large_64(cpi, bsize, mi_row, mi_col, x, xd, rd_stats,
                                 early_term, calculate_rd, best_sse, var_output,
                                 var_prune_threshold);
    return;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int test_skip = 1;
  unsigned int var;
  int sum;

  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  unsigned int sse8x8[256] = { 0 };
  int sum8x8[256] = { 0 };
  unsigned int var8x8[256] = { 0 };
  TX_SIZE tx_size;

  // Calculate variance for whole partition, and also save 8x8 blocks' variance
  // to be used in following transform skipping test.
  block_variance(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride,
                 4 << bw, 4 << bh, &sse, &sum, 8, sse8x8, sum8x8, var8x8);
  var = sse - (unsigned int)(((int64_t)sum * sum) >> (bw + bh + 4));
  if (var_output) {
    *var_output = var;
    if (*var_output > var_prune_threshold) {
      return;
    }
  }

  rd_stats->sse = sse;
  // Skipping test
  *early_term = 0;
  tx_size = calculate_tx_size(cpi, bsize, x, var, sse, early_term);
  assert(tx_size <= TX_16X16);
  // The code below for setting skip flag assumes transform size of at least
  // 8x8, so force this lower limit on transform.
  if (tx_size < TX_8X8) tx_size = TX_8X8;
  xd->mi[0]->tx_size = tx_size;

  MB_MODE_INFO *const mi = xd->mi[0];
  if (!calculate_rd && cpi->sf.rt_sf.sse_early_term_inter_search &&
      early_term_inter_search_with_sse(
          cpi->sf.rt_sf.sse_early_term_inter_search, bsize, sse, best_sse,
          mi->mode))
    test_skip = 0;

  if (*early_term) test_skip = 0;

  // Evaluate if the partition block is a skippable block in Y plane.
  if (test_skip) {
    unsigned int sse16x16[64] = { 0 };
    int sum16x16[64] = { 0 };
    unsigned int var16x16[64] = { 0 };
    const unsigned int *sse_tx = sse8x8;
    const unsigned int *var_tx = var8x8;
    unsigned int num_blks = 1 << (bw + bh - 2);

    if (tx_size >= TX_16X16) {
      calculate_variance(bw, bh, TX_8X8, sse8x8, sum8x8, var16x16, sse16x16,
                         sum16x16);
      sse_tx = sse16x16;
      var_tx = var16x16;
      num_blks = num_blks >> 2;
    }
    set_early_term_based_on_uv_plane(cpi, x, bsize, xd, mi_row, mi_col,
                                     early_term, num_blks, sse_tx, var_tx, sum,
                                     var, sse);
  }
  calc_rate_dist_block_param(cpi, x, rd_stats, calculate_rd, early_term, bsize,
                             sse);
}